

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O2

bool __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::
Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
::hasNext(Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
          *this)

{
  long *plVar1;
  char cVar2;
  bool bVar3;
  undefined1 uVar4;
  
  if (this->_normalizationRecording == true) {
    plVar1 = (long *)((long)(this->_algo)._unif._subs._self._M_t.
                            super___uniq_ptr_impl<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_>
                            ._M_t + 0x10);
    *plVar1 = *plVar1 + -8;
    this->_normalizationRecording = false;
    Lib::BacktrackData::backtrack(&this->_normalizationBacktrackData);
  }
  do {
    if ((this->_leafData).
        super_OptionBase<Lib::VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*>_>._isSome ==
        true) {
      cVar2 = (**(code **)(*(long *)(this->_leafData).
                                    super_OptionBase<Lib::VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*>_>
                                    ._elem._elem + 0x10))();
      if (cVar2 != '\0') break;
    }
    bVar3 = findNextLeaf(this);
  } while (bVar3);
  if ((this->_leafData).
      super_OptionBase<Lib::VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*>_>._isSome ==
      true) {
    uVar4 = (**(code **)(*(long *)(this->_leafData).
                                  super_OptionBase<Lib::VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*>_>
                                  ._elem._elem + 0x10))();
    return (bool)uVar4;
  }
  return false;
}

Assistant:

bool hasNext()
      {
        if(_normalizationRecording) {
          _algo.bdDone();
          _normalizationRecording=false;
          _normalizationBacktrackData.backtrack();
        }

        while(!hasLeafData() && findNextLeaf()) {}
        return hasLeafData();
      }